

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void * stb__alloc_chunk(stb__alloc *src,int size,int align,int pre_align)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  stb__chunk *psVar4;
  void *pvVar5;
  undefined8 *puVar6;
  int iVar7;
  size_t __size;
  int iVar8;
  stb__chunk *c;
  stb__chunk *psVar9;
  
  psVar4 = src->chunks;
  psVar9 = (stb__chunk *)((long)&psVar4[-1].alloc + 2);
  if (size <= stb_alloc_chunk_size) {
    pvVar5 = stb__try_chunk(psVar9,size,align,pre_align);
    if (pvVar5 != (void *)0x0) {
LAB_0019213b:
      piVar1 = (int *)((long)&psVar4->data_left + 2);
      *piVar1 = *piVar1 + 1;
      return pvVar5;
    }
    if (psVar9->next != (stb__chunk *)0x0) {
      pvVar5 = stb__try_chunk(psVar9->next,size,align,pre_align);
      if (pvVar5 != (void *)0x0) goto LAB_0019213b;
      psVar9 = src->chunks;
      puVar2 = *(undefined8 **)((long)&psVar9[-1].alloc + 2);
      if ((puVar2 != (undefined8 *)0x0) &&
         (*(int *)((long)&psVar9->next + 6) <= *(int *)(puVar2 + 1))) {
        puVar6 = (undefined8 *)((long)&psVar9[-1].alloc + 2);
        *puVar6 = *puVar2;
        *puVar2 = puVar6;
        src->chunks = (stb__chunk *)((long)puVar2 + 2);
      }
      psVar9 = (stb__chunk *)((long)&src->chunks[-1].alloc + 2);
    }
  }
  iVar7 = stb_alloc_chunk_size;
  if (pre_align != 0) {
    __assert_fail("sizeof(*n) + pre_align <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0xaa0,"void *stb__alloc_chunk(stb__alloc *, int, int, int)");
  }
  iVar3 = size;
  if (size < stb_alloc_chunk_size) {
    iVar3 = stb_alloc_chunk_size;
  }
  psVar4 = (stb__chunk *)malloc((long)(iVar3 + 0x10));
  if (psVar4 != (stb__chunk *)0x0) {
    iVar3 = align + 0x10;
    if (iVar7 <= size) {
      iVar7 = size;
    }
    iVar8 = iVar7 + -0x10;
    __size = (long)iVar7 + (long)iVar3 + 0x10;
    do {
      psVar4->data_left = iVar8;
      pvVar5 = stb__try_chunk(psVar4,size,align,0);
      if (pvVar5 != (void *)0x0) {
        psVar4->next = psVar9;
        src->chunks = (stb__chunk *)((long)&psVar4->next + 2);
        psVar4->alloc = 1;
        if (iVar8 - size != -0x10) {
          return pvVar5;
        }
        psVar9 = psVar4->next;
        if (psVar9 == (stb__chunk *)0x0) {
          return pvVar5;
        }
        if (psVar9->data_left < psVar4->data_left) {
          return pvVar5;
        }
        psVar4->next = psVar9->next;
        psVar9->next = psVar4;
        src->chunks = (stb__chunk *)((long)&psVar9->next + 2);
        return pvVar5;
      }
      free(psVar4);
      psVar4 = (stb__chunk *)malloc(__size);
      iVar8 = iVar8 + iVar3;
      __size = __size + (long)iVar3;
    } while (psVar4 != (stb__chunk *)0x0);
  }
  return (void *)0x0;
}

Assistant:

static void * stb__alloc_chunk(stb__alloc *src, int size, int align, int pre_align)
{
   void *p;
   stb__chunk *c = stb__chunks(src);

   if (c && size <= stb_alloc_chunk_size) {

      p = stb__try_chunk(c, size, align, pre_align);
      if (p) { ++c->alloc; return p; }

      // try a second chunk to reduce wastage
      if (c->next) {
         p = stb__try_chunk(c->next, size, align, pre_align);
         if (p) { ++c->alloc; return p; }
   
         // put the bigger chunk first, since the second will get buried
         // the upshot of this is that, until it gets allocated from, chunk #2
         // is always the largest remaining chunk. (could formalize
         // this with a heap!)
         stb__sort_chunks(src);
         c = stb__chunks(src);
      }
   }

   // allocate a new chunk
   {
      stb__chunk *n;

      int chunk_size = stb_alloc_chunk_size;
      // we're going to allocate a new chunk to put this in
      if (size > chunk_size)
         chunk_size = size;

      assert(sizeof(*n) + pre_align <= 16);

      // loop trying to allocate a large enough chunk
      // the loop is because the alignment may cause problems if it's big...
      // and we don't know what our chunk alignment is going to be
      while (1) {
         n = (stb__chunk *) malloc(16 + chunk_size);
         if (n == NULL) return NULL;

         n->data_left = chunk_size - sizeof(*n);

         p = stb__try_chunk(n, size, align, pre_align);
         if (p != NULL) {
            n->next = c;
            stb__setchunks(src, n);

            // if we just used up the whole block immediately,
            // move the following chunk up
            n->alloc = 1;
            if (size == chunk_size)
               stb__sort_chunks(src);

            return p;
         }

         free(n);
         chunk_size += 16+align;
      }
   }
}